

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O3

void al_invert_transform(ALLEGRO_TRANSFORM *trans)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar8 [16];
  
  fVar1 = trans->m[1][1];
  fVar2 = trans->m[1][0];
  fVar3 = trans->m[0][0];
  fVar4 = trans->m[0][1];
  uVar5 = *(undefined8 *)trans->m[3];
  fVar14 = (float)uVar5;
  fVar15 = (float)((ulong)uVar5 >> 0x20);
  auVar10._0_8_ = CONCAT44(fVar3,fVar2) ^ 0x80000000;
  auVar10._8_4_ = 0x80000000;
  auVar10._12_4_ = 0;
  fVar13 = fVar3 * fVar1 - fVar4 * fVar2;
  auVar11._0_4_ = fVar2 * fVar15 - fVar1 * fVar14;
  auVar11._4_4_ = fVar4 * fVar14 - fVar15 * fVar3;
  auVar11._8_4_ = 0.0 - fVar15 * 0.0;
  auVar11._12_4_ = 0;
  auVar12._4_4_ = fVar13;
  auVar12._0_4_ = fVar13;
  auVar12._8_4_ = fVar13;
  auVar12._12_4_ = fVar13;
  auVar12 = divps(auVar11,auVar12);
  *(long *)trans->m[3] = auVar12._0_8_;
  auVar9._4_8_ = 0;
  auVar9._0_4_ = fVar1;
  auVar9._12_4_ = 0x80000000;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._0_8_ = CONCAT44(fVar4,fVar1) ^ 0x8000000000000000;
  auVar6._4_4_ = fVar13;
  auVar6._0_4_ = fVar13;
  auVar6._8_4_ = fVar13;
  auVar6._12_4_ = fVar13;
  auVar12 = divps(auVar8,auVar6);
  *(long *)trans->m[0] = auVar12._0_8_;
  auVar7._4_4_ = fVar13;
  auVar7._0_4_ = fVar13;
  auVar7._8_4_ = fVar13;
  auVar7._12_4_ = fVar13;
  auVar12 = divps(auVar10,auVar7);
  *(long *)trans->m[1] = auVar12._0_8_;
  return;
}

Assistant:

void al_invert_transform(ALLEGRO_TRANSFORM *trans)
{
   float det, t;
   ASSERT(trans);

   det =  trans->m[0][0] *  trans->m[1][1] -  trans->m[1][0] *  trans->m[0][1];

   t =  trans->m[3][0];
   trans->m[3][0] = ( trans->m[1][0] *  trans->m[3][1] - t *  trans->m[1][1]) / det;
   trans->m[3][1] = (t *  trans->m[0][1] -  trans->m[0][0] *  trans->m[3][1]) / det;

   t =  trans->m[0][0];
   trans->m[0][0] =  trans->m[1][1] / det;
   trans->m[1][1] = t / det;

   trans->m[0][1] = - trans->m[0][1] / det;
   trans->m[1][0] = - trans->m[1][0] / det;
}